

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O2

void __thiscall HashUtil_Sha512ByteData160_Test::TestBody(HashUtil_Sha512ByteData160_Test *this)

{
  char *message;
  AssertHelper local_70;
  string local_68;
  AssertionResult gtest_ar;
  ByteData byte_data;
  ByteData160 target;
  
  std::__cxx11::string::string
            ((string *)&local_68,"0123456789abcdef0123456789abcdef01234567",(allocator *)&byte_data)
  ;
  cfd::core::ByteData160::ByteData160(&target,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  cfd::core::HashUtil::Sha512(&byte_data,&target);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_68,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"a0328b2336a761329ef0ce5bd23743173cad5528bfc21cc7b493ea6a1f4cd7ef888e6fb7ca8f294e8e5f2d2459bc72880522bd43d64e5068bc2a8ea21d27ea70\""
             ,local_68._M_dataplus._M_p,
             "a0328b2336a761329ef0ce5bd23743173cad5528bfc21cc7b493ea6a1f4cd7ef888e6fb7ca8f294e8e5f2d2459bc72880522bd43d64e5068bc2a8ea21d27ea70"
            );
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x135,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&target);
  return;
}

Assistant:

TEST(HashUtil, Sha512ByteData160) {
  ByteData160 target("0123456789abcdef0123456789abcdef01234567");
  ByteData byte_data = HashUtil::Sha512(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "a0328b2336a761329ef0ce5bd23743173cad5528bfc21cc7b493ea6a1f4cd7ef888e6fb7ca8f294e8e5f2d2459bc72880522bd43d64e5068bc2a8ea21d27ea70");
}